

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filepath_tests.cpp
# Opt level: O2

void __thiscall
iu_FilePath_x_iutest_x_Normalize_Test::iu_FilePath_x_iutest_x_Normalize_Test
          (iu_FilePath_x_iutest_x_Normalize_Test *this)

{
  iutest::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0038e448;
  return;
}

Assistant:

IUTEST(FilePath, Normalize)
{
    ::iutest::internal::FilePath path("path//to///dir////file.txt");
#ifdef IUTEST_OS_WINDOWS
    IUTEST_EXPECT_EQ("path\\to\\dir\\file.txt", path);
#else
    IUTEST_EXPECT_EQ("path/to/dir/file.txt", path);
#endif
}